

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleExtract(TranslateToFuzzReader *this,Type type)

{
  value_type_conflict2 vVar1;
  bool bVar2;
  Index IVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  value_type_conflict2 *pvVar7;
  Expression *tuple;
  Iterator IVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  bool local_101;
  Expression *child;
  Type TStack_e0;
  Index index;
  ulong local_d8;
  size_t injected;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_c8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_b8;
  undefined1 local_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newElements;
  Type *t;
  Iterator __end1;
  undefined1 local_68 [8];
  Iterator __begin1;
  Type *__range1;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> extractIndices;
  Type tupleType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  uVar4 = wasm::Type::isDefaultable();
  if ((uVar4 & 1) == 0) {
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    bVar2 = FeatureSet::hasMultivalue((FeatureSet *)(this->wasm + 0x178));
    if (!bVar2) {
      __assert_fail("wasm.features.hasMultivalue()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb01,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    bVar2 = Type::isSingle((Type *)&this_local);
    local_101 = false;
    if (bVar2) {
      local_101 = Type::isConcrete((Type *)&this_local);
    }
    if (local_101 == false) {
      __assert_fail("type.isSingle() && type.isConcrete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb02,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)getTupleType(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    __range1 = (Type *)0x0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    IVar8 = Type::begin((Type *)__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    local_68 = (undefined1  [8])
               IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
    while( true ) {
      __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar9.index;
      t = PVar9.parent;
      bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_68,
                         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
      if (!bVar2) break;
      newElements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)wasm::Type::Iterator::operator*((Iterator *)local_68);
      bVar2 = Type::operator==(newElements.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(Type *)&this_local);
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                   (value_type_conflict2 *)&__range1);
      }
      __range1 = (Type *)((long)&__range1->id + 1);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_68);
      PVar9.index = (size_t)__end1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar9.parent = t;
    }
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    if (sVar5 == 0) {
      local_b8 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 Type::begin((Type *)&extractIndices.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_c8 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 Type::end((Type *)&extractIndices.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<wasm::Type>::allocator((allocator<wasm::Type> *)((long)&injected + 7));
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_a8,(Iterator)local_b8,
                 (Iterator)local_c8,(allocator<wasm::Type> *)((long)&injected + 7));
      std::allocator<wasm::Type>::~allocator((allocator<wasm::Type> *)((long)&injected + 7));
      sVar5 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a8);
      IVar3 = upTo(this,(Index)sVar5);
      local_d8 = (ulong)IVar3;
      pvVar6 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                         ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a8,local_d8);
      pvVar6->id = (uintptr_t)this_local;
      wasm::Type::Type(&stack0xffffffffffffff20,(vector *)local_a8);
      extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)TStack_e0.id;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&local_d8);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a8);
    }
    pvVar7 = pick<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    vVar1 = *pvVar7;
    tuple = make(this,(Type)extractIndices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    type_local.id = (uintptr_t)Builder::makeTupleExtract(&this->builder,tuple,(Index)vVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleExtract(Type type) {
  // Tuples can require locals in binary format conversions.
  if (!type.isDefaultable()) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasMultivalue());
  assert(type.isSingle() && type.isConcrete());
  Type tupleType = getTupleType();

  // Find indices from which we can extract `type`
  std::vector<size_t> extractIndices;
  size_t i = 0;
  for (const auto& t : tupleType) {
    if (t == type) {
      extractIndices.push_back(i);
    }
    ++i;
  }

  // If there are none, inject one
  if (extractIndices.size() == 0) {
    std::vector<Type> newElements(tupleType.begin(), tupleType.end());
    size_t injected = upTo(newElements.size());
    newElements[injected] = type;
    tupleType = Type(newElements);
    extractIndices.push_back(injected);
  }

  Index index = pick(extractIndices);
  Expression* child = make(tupleType);
  return builder.makeTupleExtract(child, index);
}